

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  pointer *ppbVar1;
  sigaction *__act;
  pointer pbVar2;
  InternalRunDeathTestFlag *pIVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  int *piVar9;
  void *__addr;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  pointer *pppcVar10;
  unsigned_long *puVar11;
  size_type *psVar12;
  ulong *puVar13;
  long *plVar14;
  _func_void *p_Var15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  _func_void *extraout_RDX_02;
  _func_void *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar18;
  ulong uVar19;
  pointer pbVar20;
  pointer ppcVar21;
  ulong uVar22;
  undefined8 uVar23;
  const_iterator __position;
  size_t __len;
  size_type *local_310;
  string filter_flag;
  sigaction ignore_sigprof_action;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  string local_1c0;
  size_type *local_1a0;
  string internal_flag;
  ExecDeathTestArgs args_2;
  undefined1 local_160 [8];
  Arguments args;
  int local_13c;
  int local_138;
  int death_test_index;
  int pipe_fd [2];
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  _func_void *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  long local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  pointer *local_50;
  long local_48;
  pointer local_40;
  long lStack_38;
  
  UnitTest::GetInstance();
  pIVar3 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  local_13c = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar3 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    return EXECUTE_TEST;
  }
  iVar4 = pipe(&local_138);
  if (iVar4 == -1) {
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CHECK failed: File ","");
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (pointer *)*puVar8;
    pppcVar10 = (pointer *)(puVar8 + 2);
    if (local_50 == pppcVar10) {
      local_40 = *pppcVar10;
      lStack_38 = puVar8[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *pppcVar10;
    }
    local_48 = puVar8[1];
    *puVar8 = pppcVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (_func_void *)*plVar7;
    p_Var15 = (_func_void *)(plVar7 + 2);
    if (local_90 == p_Var15) {
      local_80 = *(ulong *)p_Var15;
      lStack_78 = plVar7[3];
      local_90 = (_func_void *)&local_80;
    }
    else {
      local_80 = *(ulong *)p_Var15;
    }
    local_88 = plVar7[1];
    *plVar7 = (long)p_Var15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_f0._M_dataplus._M_p._0_4_ = 0x46a;
    StreamableToString<int>(&local_d0,(int *)&local_f0);
    uVar22 = 0xf;
    if (local_90 != (_func_void *)&local_80) {
      uVar22 = local_80;
    }
    if (uVar22 < local_d0._M_string_length + local_88) {
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar23 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar23 < local_d0._M_string_length + local_88) goto LAB_00131897;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_00131897:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)*puVar8;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar17) {
      local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_b0.field_2._8_8_ = puVar8[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    }
    local_b0._M_string_length = puVar8[1];
    *puVar8 = paVar17;
    puVar8[1] = 0;
    paVar17->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    filter_flag.field_2._8_8_ = *plVar7;
    puVar11 = (unsigned_long *)(plVar7 + 2);
    if ((unsigned_long *)filter_flag.field_2._8_8_ == puVar11) {
      ignore_sigprof_action.sa_mask.__val[0] = *puVar11;
      ignore_sigprof_action.sa_mask.__val[1] = plVar7[3];
      filter_flag.field_2._8_8_ = &ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = *puVar11;
    }
    ignore_sigprof_action.__sigaction_handler =
         *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar7 + 1);
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append(filter_flag.field_2._M_local_buf + 8);
    ignore_sigprof_action.sa_restorer = (_func_void *)*puVar8;
    p_Var15 = (_func_void *)(puVar8 + 2);
    if (ignore_sigprof_action.sa_restorer == p_Var15) {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)p_Var15;
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar8[3];
      ignore_sigprof_action.sa_restorer =
           (_func_void *)
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)p_Var15;
    }
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar8[1];
    *puVar8 = p_Var15;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    DeathTestAbort((string *)&ignore_sigprof_action.sa_restorer);
    puVar8 = extraout_RAX_02;
    ignore_sigprof_action.sa_restorer = extraout_RDX_02;
LAB_0013227e:
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)p_Var15;
  }
  else {
    iVar4 = fcntl(death_test_index,2,0);
    if (iVar4 != -1) {
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"--","");
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
      pppcVar10 = (pointer *)(plVar7 + 2);
      if ((pointer *)*plVar7 == pppcVar10) {
        local_40 = *pppcVar10;
        lStack_38 = plVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar10;
        local_50 = (pointer *)*plVar7;
      }
      local_48 = plVar7[1];
      *plVar7 = (long)pppcVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (_func_void *)&local_80;
      p_Var15 = (_func_void *)(plVar7 + 2);
      if ((_func_void *)*plVar7 == p_Var15) {
        local_80 = *(ulong *)p_Var15;
        lStack_78 = plVar7[3];
      }
      else {
        local_80 = *(ulong *)p_Var15;
        local_90 = (_func_void *)*plVar7;
      }
      local_88 = plVar7[1];
      *plVar7 = (long)p_Var15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar17) {
        local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_b0.field_2._8_8_ = plVar7[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_b0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_b0._M_string_length = plVar7[1];
      *plVar7 = (long)paVar17;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
      filter_flag.field_2._8_8_ = &ignore_sigprof_action.sa_mask;
      puVar11 = (unsigned_long *)(plVar7 + 2);
      if ((unsigned_long *)*plVar7 == puVar11) {
        ignore_sigprof_action.sa_mask.__val[0] = *puVar11;
        ignore_sigprof_action.sa_mask.__val[1] = plVar7[3];
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *puVar11;
        filter_flag.field_2._8_8_ = (unsigned_long *)*plVar7;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar7 + 1);
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append(filter_flag.field_2._M_local_buf + 8);
      ppbVar1 = &args_1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      p_Var15 = (_func_void *)(plVar7 + 2);
      if ((_func_void *)*plVar7 == p_Var15) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)p_Var15;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar7[3];
        ignore_sigprof_action.sa_restorer = (_func_void *)ppbVar1;
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)p_Var15;
        ignore_sigprof_action.sa_restorer = (_func_void *)*plVar7;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar7[1];
      *plVar7 = (long)p_Var15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&ignore_sigprof_action.sa_restorer);
      local_310 = &filter_flag._M_string_length;
      psVar12 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar12) {
        filter_flag._M_string_length = *psVar12;
        filter_flag.field_2._M_allocated_capacity = plVar7[3];
      }
      else {
        filter_flag._M_string_length = *psVar12;
        local_310 = (size_type *)*plVar7;
      }
      filter_flag._M_dataplus._M_p = (pointer)plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((pointer *)ignore_sigprof_action.sa_restorer != ppbVar1) {
        operator_delete(ignore_sigprof_action.sa_restorer);
      }
      if ((__sigset_t *)filter_flag.field_2._8_8_ != &ignore_sigprof_action.sa_mask) {
        operator_delete((void *)filter_flag.field_2._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_90 != (_func_void *)&local_80) {
        operator_delete(local_90);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      pipe_fd = (int  [2])&local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)pipe_fd,"--","");
      plVar7 = (long *)std::__cxx11::string::append((char *)pipe_fd);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      puVar13 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_110.field_2._M_allocated_capacity = *puVar13;
        local_110.field_2._8_8_ = plVar7[3];
      }
      else {
        local_110.field_2._M_allocated_capacity = *puVar13;
        local_110._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_110._M_string_length = plVar7[1];
      *plVar7 = (long)puVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_110);
      plVar14 = plVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar14) {
        local_f0.field_2._M_allocated_capacity = *plVar14;
        local_f0.field_2._8_8_ = plVar7[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *plVar14;
        local_f0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_f0._M_string_length = plVar7[1];
      *plVar7 = (long)plVar14;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      puVar13 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_d0.field_2._M_allocated_capacity = *puVar13;
        local_d0.field_2._8_8_ = plVar7[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar13;
        local_d0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_d0._M_string_length = plVar7[1];
      *plVar7 = (long)puVar13;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar17) {
        local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_60._8_8_ = plVar7[3];
        local_70 = &local_60;
      }
      else {
        local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar7;
      }
      local_68 = plVar7[1];
      *plVar7 = (long)paVar17;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
      pppcVar10 = (pointer *)(plVar7 + 2);
      if ((pointer *)*plVar7 == pppcVar10) {
        local_40 = *pppcVar10;
        lStack_38 = plVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar10;
        local_50 = (pointer *)*plVar7;
      }
      local_48 = plVar7[1];
      *plVar7 = (long)pppcVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      StreamableToString<int>((string *)local_160,&this->line_);
      ppcVar21 = (pointer)0xf;
      if (local_50 != &local_40) {
        ppcVar21 = local_40;
      }
      if (ppcVar21 <
          (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start + local_48)) {
        ppcVar21 = (pointer)0xf;
        if (local_160 !=
            (undefined1  [8])
            &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          ppcVar21 = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
        if (ppcVar21 <
            (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start + local_48)) goto LAB_00130536;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)local_160,0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_00130536:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_160);
      }
      local_90 = (_func_void *)&local_80;
      p_Var15 = (_func_void *)(puVar8 + 2);
      if ((_func_void *)*puVar8 == p_Var15) {
        local_80 = *(ulong *)p_Var15;
        lStack_78 = puVar8[3];
      }
      else {
        local_80 = *(ulong *)p_Var15;
        local_90 = (_func_void *)*puVar8;
      }
      local_88 = puVar8[1];
      *puVar8 = p_Var15;
      puVar8[1] = 0;
      *p_Var15 = (_func_void)0x0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar17) {
        local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_b0.field_2._8_8_ = puVar8[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_b0._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_b0._M_string_length = puVar8[1];
      *puVar8 = paVar17;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      StreamableToString<int>((string *)((long)&internal_flag.field_2 + 8),&local_13c);
      uVar22 = CONCAT44(args_2.argv._4_4_,(int)args_2.argv) + local_b0._M_string_length;
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar23 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar23 < uVar22) {
        uVar19 = 0xf;
        if ((int *)internal_flag.field_2._8_8_ != &args_2.close_fd) {
          uVar19 = args_2._8_8_;
        }
        if (uVar19 < uVar22) goto LAB_0013066a;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)((long)&internal_flag.field_2 + 8),0,(char *)0x0,
                            (ulong)local_b0._M_dataplus._M_p);
      }
      else {
LAB_0013066a:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b0,internal_flag.field_2._8_8_);
      }
      filter_flag.field_2._8_8_ = &ignore_sigprof_action.sa_mask;
      puVar11 = puVar8 + 2;
      if ((unsigned_long *)*puVar8 == puVar11) {
        ignore_sigprof_action.sa_mask.__val[0] = *puVar11;
        ignore_sigprof_action.sa_mask.__val[1] = puVar8[3];
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *puVar11;
        filter_flag.field_2._8_8_ = (unsigned_long *)*puVar8;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(puVar8 + 1);
      *puVar8 = puVar11;
      puVar8[1] = 0;
      *(undefined1 *)puVar11 = 0;
      plVar7 = (long *)std::__cxx11::string::append(filter_flag.field_2._M_local_buf + 8);
      p_Var15 = (_func_void *)(plVar7 + 2);
      if ((_func_void *)*plVar7 == p_Var15) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)p_Var15;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar7[3];
        ignore_sigprof_action.sa_restorer = (_func_void *)ppbVar1;
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)p_Var15;
        ignore_sigprof_action.sa_restorer = (_func_void *)*plVar7;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar7[1];
      *plVar7 = (long)p_Var15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      StreamableToString<int>(&local_1c0,&death_test_index);
      pbVar2 = (pointer)((long)&((args_1.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        local_1c0._M_string_length);
      pbVar20 = (pointer)0xf;
      if ((pointer *)ignore_sigprof_action.sa_restorer != ppbVar1) {
        pbVar20 = args_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (pbVar20 < pbVar2) {
        uVar23 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1c0._M_dataplus._M_p._4_4_,local_1c0._M_dataplus._M_p._0_4_) !=
            &local_1c0.field_2) {
          uVar23 = local_1c0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar23 < pbVar2) goto LAB_0013079e;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1c0,0,(char *)0x0,(ulong)ignore_sigprof_action.sa_restorer
                           );
      }
      else {
LAB_0013079e:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&ignore_sigprof_action.sa_restorer,
                            (ulong)CONCAT44(local_1c0._M_dataplus._M_p._4_4_,
                                            local_1c0._M_dataplus._M_p._0_4_));
      }
      local_1a0 = &internal_flag._M_string_length;
      psVar12 = puVar8 + 2;
      if ((size_type *)*puVar8 == psVar12) {
        internal_flag._M_string_length = *psVar12;
        internal_flag.field_2._M_allocated_capacity = puVar8[3];
      }
      else {
        internal_flag._M_string_length = *psVar12;
        local_1a0 = (size_type *)*puVar8;
      }
      internal_flag._M_dataplus._M_p = (pointer)puVar8[1];
      *puVar8 = psVar12;
      puVar8[1] = 0;
      *(undefined1 *)psVar12 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1c0._M_dataplus._M_p._4_4_,local_1c0._M_dataplus._M_p._0_4_) !=
          &local_1c0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1c0._M_dataplus._M_p._4_4_,local_1c0._M_dataplus._M_p._0_4_))
        ;
      }
      if ((pointer *)ignore_sigprof_action.sa_restorer != ppbVar1) {
        operator_delete(ignore_sigprof_action.sa_restorer);
      }
      if ((__sigset_t *)filter_flag.field_2._8_8_ != &ignore_sigprof_action.sa_mask) {
        operator_delete((void *)filter_flag.field_2._8_8_);
      }
      if ((int *)internal_flag.field_2._8_8_ != &args_2.close_fd) {
        operator_delete((void *)internal_flag.field_2._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_90 != (_func_void *)&local_80) {
        operator_delete(local_90);
      }
      if (local_160 !=
          (undefined1  [8])
          &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete((void *)local_160);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if (pipe_fd != (int  [2])&local_120) {
        operator_delete((void *)pipe_fd);
      }
      Arguments::Arguments((Arguments *)local_160);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&g_argvs_abi_cxx11_;
      if (g_injected_test_argvs_abi_cxx11_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __x = g_injected_test_argvs_abi_cxx11_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ignore_sigprof_action.sa_restorer,__x);
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)local_160,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&ignore_sigprof_action.sa_restorer);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&ignore_sigprof_action.sa_restorer);
      __position._M_current =
           args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start + -1;
      ignore_sigprof_action.sa_restorer = (_func_void *)strdup((char *)local_310);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)local_160,__position,
                 (value_type *)&ignore_sigprof_action.sa_restorer);
      ignore_sigprof_action.sa_restorer = (_func_void *)strdup((char *)local_1a0);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)local_160,
                 (const_iterator)
                 (args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start + -1),
                 (value_type *)&ignore_sigprof_action.sa_restorer);
      ignore_sigprof_action.sa_restorer = (_func_void *)ppbVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ignore_sigprof_action.sa_restorer,"");
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((pointer *)ignore_sigprof_action.sa_restorer != ppbVar1) {
        operator_delete(ignore_sigprof_action.sa_restorer);
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      internal_flag.field_2._8_8_ = local_160;
      args_2.argv._0_4_ = local_138;
      __act = (sigaction *)((long)&filter_flag.field_2 + 8);
      memset(__act,0,0x98);
      sigemptyset((sigset_t *)&ignore_sigprof_action);
      filter_flag.field_2._8_8_ = 1;
      do {
        iVar4 = sigaction(0x1b,__act,(sigaction *)&ignore_sigprof_action.sa_restorer);
        if (iVar4 != -1) {
          if (FLAGS_gtest_death_test_use_fork != '\0') {
            iVar4 = fork();
            if (iVar4 == 0) {
              ExecDeathTestChildMain((void *)((long)&internal_flag.field_2 + 8));
              goto LAB_0013117c;
            }
LAB_00130baf:
            goto LAB_00130bb6;
          }
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
LAB_0013117c:
            AssumeRole();
          }
          uVar5 = getpagesize();
          __len = (size_t)(int)uVar5;
          __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
          if (__addr == (void *)0xffffffffffffffff) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"CHECK failed: File ","");
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
            local_d0._M_dataplus._M_p = (pointer)*puVar8;
            puVar13 = puVar8 + 2;
            if ((ulong *)local_d0._M_dataplus._M_p == puVar13) {
              local_d0.field_2._M_allocated_capacity = *puVar13;
              local_d0.field_2._8_8_ = puVar8[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *puVar13;
            }
            local_d0._M_string_length = puVar8[1];
            *puVar8 = puVar13;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
            local_70 = &local_60;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8;
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar8 + 2);
            if (paVar17 != paVar16) goto LAB_00131bae;
            local_60._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_60._8_8_ = puVar8[3];
            goto LAB_00131bb9;
          }
          lVar18 = 0;
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
            lVar18 = __len - 0x40;
          }
          if ((uVar5 < 0x41) || (((ulong)(lVar18 + (long)__addr) & 0x3f) != 0)) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"CHECK failed: File ","");
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
            local_d0._M_dataplus._M_p = (pointer)*puVar8;
            puVar13 = puVar8 + 2;
            if ((ulong *)local_d0._M_dataplus._M_p == puVar13) {
              local_d0.field_2._M_allocated_capacity = *puVar13;
              local_d0.field_2._8_8_ = puVar8[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *puVar13;
            }
            local_d0._M_string_length = puVar8[1];
            *puVar8 = puVar13;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
            local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar8;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar8 + 2);
            if (local_70 == paVar17) {
              local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
              local_60._8_8_ = puVar8[3];
              local_70 = &local_60;
            }
            else {
              local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
            }
            local_68 = puVar8[1];
            *puVar8 = paVar17;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            pipe_fd[0] = 0x441;
            StreamableToString<int>(&local_110,pipe_fd);
            uVar23 = 0xf;
            if (local_70 != &local_60) {
              uVar23 = local_60._M_allocated_capacity;
            }
            if ((ulong)uVar23 < local_110._M_string_length + local_68) {
              uVar23 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                uVar23 = local_110.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar23 < local_110._M_string_length + local_68) goto LAB_00131cd6;
              puVar8 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_110,0,(char *)0x0,(ulong)local_70);
            }
            else {
LAB_00131cd6:
              puVar8 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
            }
            local_50 = (pointer *)*puVar8;
            pppcVar10 = (pointer *)(puVar8 + 2);
            if (local_50 == pppcVar10) {
              local_40 = *pppcVar10;
              lStack_38 = puVar8[3];
              local_50 = &local_40;
            }
            else {
              local_40 = *pppcVar10;
            }
            local_48 = puVar8[1];
            *puVar8 = pppcVar10;
            puVar8[1] = 0;
            *(undefined1 *)pppcVar10 = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
            local_90 = (_func_void *)*puVar8;
            p_Var15 = (_func_void *)(puVar8 + 2);
            if (local_90 == p_Var15) {
              local_80 = *(ulong *)p_Var15;
              lStack_78 = puVar8[3];
              local_90 = (_func_void *)&local_80;
            }
            else {
              local_80 = *(ulong *)p_Var15;
            }
            local_88 = puVar8[1];
            *puVar8 = p_Var15;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar8;
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar8 + 2);
            if (paVar17 != paVar16) goto LAB_0013245b;
            local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
            local_b0.field_2._8_8_ = puVar8[3];
            goto LAB_0013246c;
          }
          iVar4 = clone(ExecDeathTestChildMain,(void *)(lVar18 + (long)__addr),0x11,
                        (void *)((long)&internal_flag.field_2 + 8));
          iVar6 = munmap(__addr,__len);
          if (iVar6 != -1) goto LAB_00130baf;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"CHECK failed: File ","");
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
          local_d0._M_dataplus._M_p = (pointer)*puVar8;
          puVar13 = puVar8 + 2;
          if ((ulong *)local_d0._M_dataplus._M_p == puVar13) {
            local_d0.field_2._M_allocated_capacity = *puVar13;
            local_d0.field_2._8_8_ = puVar8[3];
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *puVar13;
          }
          local_d0._M_string_length = puVar8[1];
          *puVar8 = puVar13;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
          local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar8;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar8 + 2);
          if (local_70 == paVar17) {
            local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_60._8_8_ = puVar8[3];
            local_70 = &local_60;
          }
          else {
            local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
          }
          local_68 = puVar8[1];
          *puVar8 = paVar17;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          pipe_fd[0] = 0x445;
          StreamableToString<int>(&local_110,pipe_fd);
          uVar23 = 0xf;
          if (local_70 != &local_60) {
            uVar23 = local_60._M_allocated_capacity;
          }
          if ((ulong)uVar23 < local_110._M_string_length + local_68) {
            uVar23 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              uVar23 = local_110.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar23 < local_110._M_string_length + local_68) goto LAB_00131d71;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_70);
          }
          else {
LAB_00131d71:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
          }
          local_50 = (pointer *)*puVar8;
          pppcVar10 = (pointer *)(puVar8 + 2);
          if (local_50 == pppcVar10) {
            local_40 = *pppcVar10;
            lStack_38 = puVar8[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *pppcVar10;
          }
          local_48 = puVar8[1];
          *puVar8 = pppcVar10;
          puVar8[1] = 0;
          *(undefined1 *)pppcVar10 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
          local_90 = (_func_void *)*puVar8;
          p_Var15 = (_func_void *)(puVar8 + 2);
          if (local_90 == p_Var15) {
            local_80 = *(ulong *)p_Var15;
            lStack_78 = puVar8[3];
            local_90 = (_func_void *)&local_80;
          }
          else {
            local_80 = *(ulong *)p_Var15;
          }
          local_88 = puVar8[1];
          *puVar8 = p_Var15;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar8;
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar8 + 2);
          if (paVar17 != paVar16) goto LAB_0013248f;
          local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_b0.field_2._8_8_ = puVar8[3];
          goto LAB_001324a0;
        }
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CHECK failed: File ","")
      ;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
      local_f0._M_dataplus._M_p = (pointer)*puVar8;
      plVar7 = puVar8 + 2;
      if ((long *)local_f0._M_dataplus._M_p == plVar7) {
        local_f0.field_2._M_allocated_capacity = *plVar7;
        local_f0.field_2._8_8_ = puVar8[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *plVar7;
      }
      local_f0._M_string_length = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
      local_d0._M_dataplus._M_p = (pointer)*puVar8;
      puVar13 = puVar8 + 2;
      if ((ulong *)local_d0._M_dataplus._M_p == puVar13) {
        local_d0.field_2._M_allocated_capacity = *puVar13;
        local_d0.field_2._8_8_ = puVar8[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar13;
      }
      local_d0._M_string_length = puVar8[1];
      *puVar8 = puVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      local_1c0._M_dataplus._M_p._0_4_ = 0x428;
      StreamableToString<int>((string *)pipe_fd,(int *)&local_1c0);
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar23 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar23 < local_128 + local_d0._M_string_length) {
        uVar23 = 0xf;
        if (pipe_fd != (int  [2])&local_120) {
          uVar23 = local_120._M_allocated_capacity;
        }
        if ((ulong)uVar23 < local_128 + local_d0._M_string_length) goto LAB_00130efb;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
      }
      else {
LAB_00130efb:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)pipe_fd);
      }
      local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar8;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if (local_70 == paVar17) {
        local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_60._8_8_ = puVar8[3];
        local_70 = &local_60;
      }
      else {
        local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
      }
      local_68 = puVar8[1];
      *puVar8 = paVar17;
      puVar8[1] = 0;
      paVar17->_M_local_buf[0] = '\0';
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      local_50 = (pointer *)*puVar8;
      pppcVar10 = (pointer *)(puVar8 + 2);
      if (local_50 == pppcVar10) {
        local_40 = *pppcVar10;
        lStack_38 = puVar8[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar10;
      }
      local_48 = puVar8[1];
      *puVar8 = pppcVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (_func_void *)*puVar8;
      p_Var15 = (_func_void *)(puVar8 + 2);
      if (local_90 == p_Var15) {
        local_80 = *(ulong *)p_Var15;
        lStack_78 = puVar8[3];
        local_90 = (_func_void *)&local_80;
      }
      else {
        local_80 = *(ulong *)p_Var15;
      }
      local_88 = puVar8[1];
      *puVar8 = p_Var15;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*puVar8;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar16) {
        local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_b0.field_2._8_8_ = puVar8[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      }
      local_b0._M_string_length = puVar8[1];
      *puVar8 = paVar16;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      DeathTestAbort(&local_b0);
      puVar8 = extraout_RAX;
      paVar17 = extraout_RDX;
      goto LAB_00131b46;
    }
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CHECK failed: File ","");
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (pointer *)*puVar8;
    pppcVar10 = (pointer *)(puVar8 + 2);
    if (local_50 == pppcVar10) {
      local_40 = *pppcVar10;
      lStack_38 = puVar8[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *pppcVar10;
    }
    local_48 = puVar8[1];
    *puVar8 = pppcVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (_func_void *)*puVar8;
    p_Var15 = (_func_void *)(puVar8 + 2);
    if (local_90 == p_Var15) {
      local_80 = *(ulong *)p_Var15;
      lStack_78 = puVar8[3];
      local_90 = (_func_void *)&local_80;
    }
    else {
      local_80 = *(ulong *)p_Var15;
    }
    local_88 = puVar8[1];
    *puVar8 = p_Var15;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    local_f0._M_dataplus._M_p._0_4_ = 0x46d;
    StreamableToString<int>(&local_d0,(int *)&local_f0);
    uVar22 = 0xf;
    if (local_90 != (_func_void *)&local_80) {
      uVar22 = local_80;
    }
    if (uVar22 < local_d0._M_string_length + local_88) {
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar23 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar23 < local_d0._M_string_length + local_88) goto LAB_00131937;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_00131937:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)*puVar8;
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar17) {
      local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_b0.field_2._8_8_ = puVar8[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    }
    local_b0._M_string_length = puVar8[1];
    *puVar8 = paVar17;
    puVar8[1] = 0;
    paVar17->_M_local_buf[0] = '\0';
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    filter_flag.field_2._8_8_ = *plVar7;
    puVar11 = (unsigned_long *)(plVar7 + 2);
    if ((unsigned_long *)filter_flag.field_2._8_8_ == puVar11) {
      ignore_sigprof_action.sa_mask.__val[0] = *puVar11;
      ignore_sigprof_action.sa_mask.__val[1] = plVar7[3];
      filter_flag.field_2._8_8_ = &ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = *puVar11;
    }
    ignore_sigprof_action.__sigaction_handler =
         *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar7 + 1);
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append(filter_flag.field_2._M_local_buf + 8);
    ignore_sigprof_action.sa_restorer = (_func_void *)*puVar8;
    p_Var15 = (_func_void *)(puVar8 + 2);
    if (ignore_sigprof_action.sa_restorer != p_Var15) goto LAB_0013227e;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)p_Var15;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar8[3];
    ignore_sigprof_action.sa_restorer =
         (_func_void *)
         &args_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  }
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar8[1];
  *puVar8 = p_Var15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort((string *)&ignore_sigprof_action.sa_restorer);
  puVar8 = extraout_RAX_03;
  local_90 = extraout_RDX_03;
  goto LAB_001322b2;
LAB_00130c48:
  do {
    iVar6 = close(death_test_index);
    if (iVar6 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar4;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_138;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)local_160);
      if (local_1a0 != &internal_flag._M_string_length) {
        operator_delete(local_1a0);
      }
      if (local_310 != &filter_flag._M_string_length) {
        operator_delete(local_310);
      }
      return OVERSEE_TEST;
    }
    piVar9 = __errno_location();
  } while (*piVar9 == 4);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
  local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar8;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_70 == paVar17) {
    local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_60._8_8_ = puVar8[3];
    local_70 = &local_60;
  }
  else {
    local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_68 = puVar8[1];
  *puVar8 = paVar17;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (pointer *)*puVar8;
  pppcVar10 = (pointer *)(puVar8 + 2);
  if (local_50 == pppcVar10) {
    local_40 = *pppcVar10;
    lStack_38 = puVar8[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *pppcVar10;
  }
  local_48 = puVar8[1];
  *puVar8 = pppcVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_110._M_dataplus._M_p._0_4_ = 0x484;
  StreamableToString<int>(&local_f0,(int *)&local_110);
  ppcVar21 = (pointer)0xf;
  if (local_50 != &local_40) {
    ppcVar21 = local_40;
  }
  if (ppcVar21 < (pointer)(local_f0._M_string_length + local_48)) {
    uVar23 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar23 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar23 < (pointer)(local_f0._M_string_length + local_48)) goto LAB_0013104c;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_0013104c:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_f0._M_dataplus._M_p);
  }
  local_90 = (_func_void *)*puVar8;
  p_Var15 = (_func_void *)(puVar8 + 2);
  if (local_90 == p_Var15) {
    local_80 = *(ulong *)p_Var15;
    lStack_78 = puVar8[3];
    local_90 = (_func_void *)&local_80;
  }
  else {
    local_80 = *(ulong *)p_Var15;
  }
  local_88 = puVar8[1];
  *puVar8 = p_Var15;
  puVar8[1] = 0;
  *p_Var15 = (_func_void)0x0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)*puVar8;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar17) {
    local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_b0.field_2._8_8_ = puVar8[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_b0._M_string_length = puVar8[1];
  *puVar8 = paVar17;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
  filter_flag.field_2._8_8_ = *plVar7;
  puVar11 = (unsigned_long *)(plVar7 + 2);
  if ((unsigned_long *)filter_flag.field_2._8_8_ == puVar11) {
    ignore_sigprof_action.sa_mask.__val[0] = *puVar11;
    ignore_sigprof_action.sa_mask.__val[1] = plVar7[3];
    filter_flag.field_2._8_8_ = &ignore_sigprof_action.sa_mask;
  }
  else {
    ignore_sigprof_action.sa_mask.__val[0] = *puVar11;
  }
  ignore_sigprof_action.__sigaction_handler =
       *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar7 + 1);
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append(filter_flag.field_2._M_local_buf + 8);
  ignore_sigprof_action.sa_restorer = (_func_void *)*puVar8;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ignore_sigprof_action.sa_restorer != paVar16) goto LAB_00131b7a;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar16->_M_allocated_capacity;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar8[3];
  ignore_sigprof_action.sa_restorer = (_func_void *)ppbVar1;
  goto LAB_00131b8b;
  while (piVar9 = __errno_location(), *piVar9 == 4) {
LAB_00130bb6:
    iVar6 = sigaction(0x1b,(sigaction *)&ignore_sigprof_action.sa_restorer,(sigaction *)0x0);
    if (iVar6 != -1) {
      if (iVar4 != -1) goto LAB_00130c48;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
      local_d0._M_dataplus._M_p = (pointer)*puVar8;
      puVar13 = puVar8 + 2;
      if ((ulong *)local_d0._M_dataplus._M_p == puVar13) {
        local_d0.field_2._M_allocated_capacity = *puVar13;
        local_d0.field_2._8_8_ = puVar8[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar13;
      }
      local_d0._M_string_length = puVar8[1];
      *puVar8 = puVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar8;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if (local_70 == paVar17) {
        local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_60._8_8_ = puVar8[3];
        local_70 = &local_60;
      }
      else {
        local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
      }
      local_68 = puVar8[1];
      *puVar8 = paVar17;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      pipe_fd[0] = 0x455;
      StreamableToString<int>(&local_110,pipe_fd);
      uVar23 = 0xf;
      if (local_70 != &local_60) {
        uVar23 = local_60._M_allocated_capacity;
      }
      if ((ulong)uVar23 < local_110._M_string_length + local_68) {
        uVar23 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          uVar23 = local_110.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar23 < local_110._M_string_length + local_68) goto LAB_00131b04;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_70);
      }
      else {
LAB_00131b04:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
      }
      local_50 = (pointer *)*puVar8;
      pppcVar10 = (pointer *)(puVar8 + 2);
      if (local_50 == pppcVar10) {
        local_40 = *pppcVar10;
        lStack_38 = puVar8[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar10;
      }
      local_48 = puVar8[1];
      *puVar8 = pppcVar10;
      puVar8[1] = 0;
      *(undefined1 *)pppcVar10 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (_func_void *)*plVar7;
      p_Var15 = (_func_void *)(plVar7 + 2);
      if (local_90 == p_Var15) {
        local_80 = *(ulong *)p_Var15;
        lStack_78 = plVar7[3];
        local_90 = (_func_void *)&local_80;
      }
      else {
        local_80 = *(ulong *)p_Var15;
      }
      local_88 = plVar7[1];
      *plVar7 = (long)p_Var15;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*plVar7;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar16) {
        local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_b0.field_2._8_8_ = plVar7[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      }
      local_b0._M_string_length = plVar7[1];
      *plVar7 = (long)paVar16;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeathTestAbort(&local_b0);
      puVar8 = extraout_RAX_04;
      local_b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_00132427;
    }
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
  local_f0._M_dataplus._M_p = (pointer)*puVar8;
  plVar7 = puVar8 + 2;
  if ((long *)local_f0._M_dataplus._M_p == plVar7) {
    local_f0.field_2._M_allocated_capacity = *plVar7;
    local_f0.field_2._8_8_ = puVar8[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *plVar7;
  }
  local_f0._M_string_length = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
  local_d0._M_dataplus._M_p = (pointer)*puVar8;
  puVar13 = puVar8 + 2;
  if ((ulong *)local_d0._M_dataplus._M_p == puVar13) {
    local_d0.field_2._M_allocated_capacity = *puVar13;
    local_d0.field_2._8_8_ = puVar8[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *puVar13;
  }
  local_d0._M_string_length = puVar8[1];
  *puVar8 = puVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_1c0._M_dataplus._M_p._0_4_ = 0x452;
  StreamableToString<int>((string *)pipe_fd,(int *)&local_1c0);
  uVar23 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    uVar23 = local_d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar23 < local_128 + local_d0._M_string_length) {
    uVar23 = 0xf;
    if (pipe_fd != (int  [2])&local_120) {
      uVar23 = local_120._M_allocated_capacity;
    }
    if ((ulong)uVar23 < local_128 + local_d0._M_string_length) goto LAB_00130fae;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
  }
  else {
LAB_00130fae:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)pipe_fd);
  }
  local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar8;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (local_70 == paVar17) {
    local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
    local_60._8_8_ = puVar8[3];
    local_70 = &local_60;
  }
  else {
    local_60._M_allocated_capacity = paVar17->_M_allocated_capacity;
  }
  local_68 = puVar8[1];
  *puVar8 = paVar17;
  puVar8[1] = 0;
  paVar17->_M_local_buf[0] = '\0';
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (pointer *)*puVar8;
  pppcVar10 = (pointer *)(puVar8 + 2);
  if (local_50 == pppcVar10) {
    local_40 = *pppcVar10;
    lStack_38 = puVar8[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *pppcVar10;
  }
  local_48 = puVar8[1];
  *puVar8 = pppcVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (_func_void *)*puVar8;
  p_Var15 = (_func_void *)(puVar8 + 2);
  if (local_90 == p_Var15) {
    local_80 = *(ulong *)p_Var15;
    lStack_78 = puVar8[3];
    local_90 = (_func_void *)&local_80;
  }
  else {
    local_80 = *(ulong *)p_Var15;
  }
  local_88 = puVar8[1];
  *puVar8 = p_Var15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if (paVar17 == paVar16) {
    local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_b0.field_2._8_8_ = puVar8[3];
  }
  else {
LAB_00131b46:
    local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_b0._M_dataplus._M_p = (pointer)paVar17;
  }
  local_b0._M_string_length = puVar8[1];
  *puVar8 = paVar16;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar8 = extraout_RAX_00;
  ignore_sigprof_action.sa_restorer = (_func_void *)extraout_RDX_00;
LAB_00131b7a:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)paVar16->_M_allocated_capacity;
LAB_00131b8b:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar8[1];
  *puVar8 = paVar16;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort((string *)&ignore_sigprof_action.sa_restorer);
  puVar8 = extraout_RAX_01;
  paVar17 = extraout_RDX_01;
LAB_00131bae:
  local_60._M_allocated_capacity = paVar16->_M_allocated_capacity;
  local_70 = paVar17;
LAB_00131bb9:
  local_68 = puVar8[1];
  *puVar8 = paVar16;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  pipe_fd[0] = 0x434;
  StreamableToString<int>(&local_110,pipe_fd);
  uVar23 = 0xf;
  if (local_70 != &local_60) {
    uVar23 = local_60._M_allocated_capacity;
  }
  if ((ulong)uVar23 < local_110._M_string_length + local_68) {
    uVar23 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar23 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar23 < local_110._M_string_length + local_68) goto LAB_00131c3b;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_00131c3b:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
  }
  local_50 = (pointer *)*puVar8;
  pppcVar10 = (pointer *)(puVar8 + 2);
  if (local_50 == pppcVar10) {
    local_40 = *pppcVar10;
    lStack_38 = puVar8[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *pppcVar10;
  }
  local_48 = puVar8[1];
  *puVar8 = pppcVar10;
  puVar8[1] = 0;
  *(undefined1 *)pppcVar10 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (_func_void *)*puVar8;
  p_Var15 = (_func_void *)(puVar8 + 2);
  if (local_90 == p_Var15) {
    local_80 = *(ulong *)p_Var15;
    lStack_78 = puVar8[3];
    local_90 = (_func_void *)&local_80;
  }
  else {
LAB_001322b2:
    local_80 = *(ulong *)p_Var15;
  }
  local_88 = puVar8[1];
  *puVar8 = p_Var15;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)*puVar8;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar16) {
    local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_b0.field_2._8_8_ = puVar8[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
LAB_00132427:
    local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
  }
  local_b0._M_string_length = puVar8[1];
  *puVar8 = paVar16;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar8 = extraout_RAX_05;
  paVar17 = extraout_RDX_05;
LAB_0013245b:
  local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
  local_b0._M_dataplus._M_p = (pointer)paVar17;
LAB_0013246c:
  local_b0._M_string_length = puVar8[1];
  *puVar8 = paVar16;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar8 = extraout_RAX_06;
  paVar17 = extraout_RDX_06;
LAB_0013248f:
  local_b0.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
  local_b0._M_dataplus._M_p = (pointer)paVar17;
LAB_001324a0:
  local_b0._M_string_length = puVar8[1];
  *puVar8 = paVar16;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_90 != (_func_void *)&local_80) {
    operator_delete(local_90);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  Arguments::~Arguments((Arguments *)local_160);
  if (local_1a0 != &internal_flag._M_string_length) {
    operator_delete(local_1a0);
  }
  if (local_310 != &filter_flag._M_string_length) {
    operator_delete(local_310);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}